

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stat.cc
# Opt level: O3

char * SSL_alert_type_string_long(int value)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = "unknown";
  if (value >> 8 == 2) {
    pcVar2 = "fatal";
  }
  pcVar1 = "warning";
  if (value >> 8 != 1) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char *SSL_alert_type_string_long(int value) {
  value >>= 8;
  if (value == SSL3_AL_WARNING) {
    return "warning";
  } else if (value == SSL3_AL_FATAL) {
    return "fatal";
  }

  return "unknown";
}